

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * __thiscall
soul::Value::createArrayOrVector
          (Value *__return_storage_ptr__,Value *this,Type *t,ArrayView<soul::Value> elements)

{
  ArrayView<soul::Value> values;
  PackedData local_70;
  Type local_48;
  undefined1 local_29;
  Value *local_28;
  Type *t_local;
  ArrayView<soul::Value> elements_local;
  Value *v;
  
  elements_local.s = elements.s;
  local_29 = 0;
  local_28 = this;
  t_local = t;
  elements_local.e = __return_storage_ptr__;
  Type::Type(&local_48,&this->type);
  Value(__return_storage_ptr__,&local_48);
  Type::~Type(&local_48);
  getData(&local_70,__return_storage_ptr__);
  values.e = elements_local.s;
  values.s = (Value *)t_local;
  PackedData::setFrom(&local_70,values);
  return __return_storage_ptr__;
}

Assistant:

Value Value::createArrayOrVector (Type t, ArrayView<Value> elements)
{
    Value v (std::move (t));
    v.getData().setFrom (elements);
    return v;
}